

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_client.cpp
# Opt level: O3

int __thiscall CNetClient::Recv(CNetClient *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  CNetRecvUnpacker *this_00;
  CNetPacketConstruct *pPacket;
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  NETADDR Addr;
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_RecvUnpacker;
  iVar3 = CNetRecvUnpacker::FetchChunk(this_00,pChunk);
  iVar4 = 1;
  if (iVar3 == 0) {
    pPacket = &(this->m_RecvUnpacker).m_Data;
    puVar1 = (this->m_RecvUnpacker).m_Data.m_aChunkData;
    do {
      iVar3 = CNetBase::UnpackPacket
                        (&this->super_CNetBase,&local_50,(this->m_RecvUnpacker).m_aBuffer,pPacket);
      if (0 < iVar3) {
        iVar4 = 0;
        goto LAB_001c6f4d;
      }
      if (iVar3 == 0) {
        uVar2 = (this->m_Connection).m_State;
        if (((uVar2 == 0) || (uVar2 == 5)) ||
           (iVar3 = net_addr_comp(&(this->m_Connection).m_PeerAddr,&local_50,1), iVar3 != 0)) {
          iVar3 = CNetTokenManager::ProcessMessage(&this->m_TokenManager,&local_50,pPacket);
          if (iVar3 != 0) {
            uVar2 = (this->m_RecvUnpacker).m_Data.m_Flags;
            if ((uVar2 & 1) == 0) {
              if (iVar3 != -1 && (uVar2 & 8) != 0) {
                pChunk->m_Flags = 2;
                pChunk->m_ClientID = -1;
                (pChunk->m_Address).type = local_50.type;
                (pChunk->m_Address).ip[0] = local_50.ip[0];
                (pChunk->m_Address).ip[1] = local_50.ip[1];
                (pChunk->m_Address).ip[2] = local_50.ip[2];
                (pChunk->m_Address).ip[3] = local_50.ip[3];
                *(undefined8 *)((pChunk->m_Address).ip + 4) = local_50.ip._4_8_;
                *(undefined8 *)((pChunk->m_Address).ip + 0xc) = local_50._16_8_;
                pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
                pChunk->m_pData = puVar1;
                if (pResponseToken != (TOKEN *)0x0) {
                  *pResponseToken = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
                }
                break;
              }
            }
            else if (*puVar1 == '\x05') {
              CNetTokenCache::AddToken
                        (&this->m_TokenCache,&local_50,(this->m_RecvUnpacker).m_Data.m_ResponseToken
                         ,3);
            }
          }
        }
        else {
          iVar3 = CNetConnection::Feed(&this->m_Connection,pPacket,&local_50);
          if ((iVar3 != 0) && (((this->m_RecvUnpacker).m_Data.m_Flags & 8) == 0)) {
            CNetRecvUnpacker::Start(this_00,&local_50,&this->m_Connection,0);
          }
        }
      }
      iVar3 = CNetRecvUnpacker::FetchChunk(this_00,pChunk);
    } while (iVar3 == 0);
    iVar4 = 1;
  }
LAB_001c6f4d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int CNetClient::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			if(m_Connection.State() != NET_CONNSTATE_OFFLINE && m_Connection.State() != NET_CONNSTATE_ERROR && net_addr_comp(m_Connection.PeerAddress(), &Addr, true) == 0)
			{
				if(m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
				{
					if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
						m_RecvUnpacker.Start(&Addr, &m_Connection, 0);
				}
			}
			else
			{
				int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
				if(!Accept)
					continue;

				if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
				{
					if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
						m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_ALLOWBROADCAST|NET_TOKENFLAG_RESPONSEONLY);
				}
				else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS && Accept != -1)
				{
					pChunk->m_Flags = NETSENDFLAG_CONNLESS;
					pChunk->m_ClientID = -1;
					pChunk->m_Address = Addr;
					pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
					pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;

					if(pResponseToken)
						*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
					return 1;
				}
			}
		}
	}
	return 0;
}